

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_sax.hpp
# Opt level: O3

bool __thiscall
nlohmann::json_abi_v3_12_0::detail::
json_sax_dom_callback_parser<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_12_0::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::key(json_sax_dom_callback_parser<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_12_0::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      *this,string_t *val)

{
  bool __x;
  mapped_type *this_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *pbVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  k;
  parse_event_t local_3d;
  int local_3c;
  data local_38;
  data local_28;
  
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::
  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_38,val);
  local_3c = (int)((ulong)((long)(this->ref_stack).
                                 super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->ref_stack).
                                super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_3d = key;
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    __x = (*(this->callback)._M_invoker)
                    ((_Any_data *)&this->callback,&local_3c,&local_3d,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_38);
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->key_keep_stack,__x);
    if ((__x) && ((this->ref_stack).
                  super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1] !=
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)0x0)) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_28,&this->discarded);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::operator[](((this->ref_stack).
                              super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1]->m_data).m_value.object
                             ,val);
      pbVar1 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator=(this_00,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)&local_28);
      this->object_element = pbVar1;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_28,false);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_28);
    }
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_38,false);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_38);
    return true;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool key(string_t& val)
    {
        BasicJsonType k = BasicJsonType(val);

        // check callback for key
        const bool keep = callback(static_cast<int>(ref_stack.size()), parse_event_t::key, k);
        key_keep_stack.push_back(keep);

        // add discarded value at given key and store the reference for later
        if (keep && ref_stack.back())
        {
            object_element = &(ref_stack.back()->m_data.m_value.object->operator[](val) = discarded);
        }

        return true;
    }